

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

pointer __thiscall
QList<SubdirsMetaMakefileGenerator::Subdir_*>::data
          (QList<SubdirsMetaMakefileGenerator::Subdir_*> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<SubdirsMetaMakefileGenerator::Subdir_*>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,
               (QArrayDataPointer<SubdirsMetaMakefileGenerator::Subdir_*> *)0x0);
  }
  return (this->d).ptr;
}

Assistant:

pointer data() { detach(); return d->data(); }